

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

void __thiscall
randomx::SuperscalarInstructionInfo::SuperscalarInstructionInfo<3ul>
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,
          MacroOp (*arr) [3],int resultOp,int dstOp,int srcOp)

{
  int iVar1;
  reference this_00;
  undefined4 in_EDX;
  pointer in_RSI;
  vector<randomx::MacroOp,_std::allocator<randomx::MacroOp>_> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  uint i;
  value_type *__x;
  uint local_2c;
  
  (in_RDI->super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>)._M_impl.
  super__Vector_impl_data._M_start = in_RSI;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>)._M_impl.
    super__Vector_impl_data._M_finish = in_EDX;
  __x = (value_type *)
        &(in_RDI->super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  std::vector<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>::vector
            ((vector<randomx::MacroOp,_std::allocator<randomx::MacroOp>_> *)0x14eebe);
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = in_R8D;
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
    super__Vector_impl_data._M_start = in_R9D;
  *(undefined4 *)
   ((long)&in_RDI[2].super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl
           .super__Vector_impl_data._M_start + 4) = in_stack_00000008;
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    std::vector<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>::push_back(in_RDI,__x);
    this_00 = std::vector<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>::back(in_RDI);
    iVar1 = MacroOp::getLatency(this_00);
    *(int *)&in_RDI[1].super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage =
         iVar1 + *(int *)&in_RDI[1].
                          super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp(&arr)[N], int resultOp, int dstOp, int srcOp)
			: name_(name), type_(type), latency_(0), resultOp_(resultOp), dstOp_(dstOp), srcOp_(srcOp) {
			for (unsigned i = 0; i < N; ++i) {
				ops_.push_back(MacroOp(arr[i]));
				latency_ += ops_.back().getLatency();
			}
			static_assert(N > 1, "Invalid array size");
		}